

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

optional<cmListFileContext> * __thiscall
cmListFileParser::CheckNesting
          (optional<cmListFileContext> *__return_storage_ptr__,cmListFileParser *this)

{
  pointer pNVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *psVar6;
  pointer lff;
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  stack;
  allocator<char> local_379;
  string local_378;
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  local_358;
  cmListFileContext *local_340;
  undefined1 local_338 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  undefined1 local_308 [24];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [16];
  bool local_2c8;
  cmListFileParser *local_2c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2b8;
  bool local_298;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_290;
  bool local_270;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_268;
  bool local_248;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_240;
  bool local_220;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_218;
  bool local_1f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1f0;
  bool local_1d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1c8;
  bool local_1a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1a0;
  bool local_180;
  pointer local_178;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_170;
  bool local_150;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f8;
  bool local_d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d0;
  bool local_b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a8;
  bool local_88;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_80;
  bool local_60;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  local_358.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lff = (this->ListFile->Functions).
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_178 = (this->ListFile->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (lff != local_178) {
    local_340 = (cmListFileContext *)__return_storage_ptr__;
    local_2c0 = this;
LAB_003b50e9:
    psVar6 = &((lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->LowerCaseName;
    iVar2 = std::__cxx11::string::compare((char *)psVar6);
    if (iVar2 == 0) {
      local_338._0_4_ = If;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,this->FileName,&local_379);
      local_180 = false;
      cmListFileContext::FromListFileFunction
                ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a0);
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::push_back(&local_358,(value_type *)local_338);
      if ((local_2c8 == true) && (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8)) {
        operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
      }
      if (local_310._M_p != local_308 + 8) {
        operator_delete(local_310._M_p,local_308._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._8_8_ != &local_320) {
        operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
      }
      if ((local_180 == true) &&
         (local_180 = false, uVar4 = local_1a0._16_8_, uVar5 = local_1a0._M_value._M_dataplus._M_p,
         local_1a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1a0._M_value + 0x10))) {
LAB_003b5a6c:
        operator_delete((void *)uVar5,uVar4 + 1);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar6);
      pNVar1 = local_358.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2 == 0) {
        if ((local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (local_358.
            super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].State != If)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,this->FileName,&local_379);
          local_38 = false;
          cmListFileContext::FromListFileFunction
                    ((cmListFileContext *)local_338,lff,&local_378,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58);
          __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
          cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
          *(undefined1 *)
           &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p =
               1;
          if ((local_2d8[8] == '\x01') &&
             (local_2d8[8] = '\0', (undefined1 *)local_2f0._0_8_ != local_2e0)) {
            operator_delete((void *)local_2f0._0_8_,(long)local_2e0 + 1);
          }
          if ((undefined1 *)local_320._8_8_ != local_308) {
            operator_delete((void *)local_320._8_8_,local_308._0_8_ + 1);
          }
          if ((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_) != local_338 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_),
                            local_338._16_8_ + 1);
          }
          if ((local_38 == true) &&
             (local_38 = false,
             local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10)))
          {
LAB_003b6065:
            operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
          }
          goto LAB_003b606d;
        }
        local_338._0_4_ = If;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,this->FileName,&local_379);
        local_1a8 = false;
        cmListFileContext::FromListFileFunction
                  ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8);
        pNVar1[-1].State = local_338._0_4_;
        cmListFileContext::operator=(&pNVar1[-1].Context,(cmListFileContext *)(local_338 + 8));
        this = local_2c0;
        if ((local_2c8 == true) && (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8))
        {
          operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
        }
        if (local_310._M_p != local_308 + 8) {
          operator_delete(local_310._M_p,local_308._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._8_8_ != &local_320) {
          operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
        }
        if ((local_1a8 == true) &&
           (local_1a8 = false, uVar4 = local_1c8._16_8_, uVar5 = local_1c8._M_value._M_dataplus._M_p
           , local_1c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1c8._M_value + 0x10)
           )) goto LAB_003b5a6c;
        goto LAB_003b5a74;
      }
      iVar2 = std::__cxx11::string::compare((char *)psVar6);
      pNVar1 = local_358.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2 == 0) {
        if ((local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (local_358.
            super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].State != If)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,this->FileName,&local_379);
          local_60 = false;
          cmListFileContext::FromListFileFunction
                    ((cmListFileContext *)local_338,lff,&local_378,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80);
          __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
          cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
          *(undefined1 *)
           &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p =
               1;
          if ((local_2d8[8] == '\x01') &&
             (local_2d8[8] = '\0', (undefined1 *)local_2f0._0_8_ != local_2e0)) {
            operator_delete((void *)local_2f0._0_8_,(long)local_2e0 + 1);
          }
          if ((undefined1 *)local_320._8_8_ != local_308) {
            operator_delete((void *)local_320._8_8_,local_308._0_8_ + 1);
          }
          if ((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_) != local_338 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_),
                            local_338._16_8_ + 1);
          }
          if ((local_60 == true) &&
             (local_60 = false, local_58._16_8_ = local_80._16_8_,
             local_58._M_value._M_dataplus._M_p = local_80._M_value._M_dataplus._M_p,
             local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)))
          goto LAB_003b6065;
          goto LAB_003b606d;
        }
        local_338._0_4_ = Else;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,this->FileName,&local_379);
        local_1d0 = false;
        cmListFileContext::FromListFileFunction
                  ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f0);
        pNVar1[-1].State = local_338._0_4_;
        cmListFileContext::operator=(&pNVar1[-1].Context,(cmListFileContext *)(local_338 + 8));
        this = local_2c0;
        if ((local_2c8 == true) && (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8))
        {
          operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
        }
        if (local_310._M_p != local_308 + 8) {
          operator_delete(local_310._M_p,local_308._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._8_8_ != &local_320) {
          operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
        }
        if ((local_1d0 == true) &&
           (local_1d0 = false, uVar4 = local_1f0._16_8_, uVar5 = local_1f0._M_value._M_dataplus._M_p
           , local_1f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1f0._M_value + 0x10)
           )) goto LAB_003b5a6c;
        goto LAB_003b5a74;
      }
      pcVar3 = "endif";
      iVar2 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar2 == 0) {
        if ((local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (Else < local_358.
                   super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].State)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,this->FileName,&local_379);
          local_88 = false;
          cmListFileContext::FromListFileFunction
                    ((cmListFileContext *)local_338,lff,&local_378,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8);
          __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
          cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
          *(undefined1 *)
           &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p =
               1;
          if ((local_2d8[8] == '\x01') &&
             (local_2d8[8] = '\0', (undefined1 *)local_2f0._0_8_ != local_2e0)) {
            operator_delete((void *)local_2f0._0_8_,(long)local_2e0 + 1);
          }
          if ((undefined1 *)local_320._8_8_ != local_308) {
            operator_delete((void *)local_320._8_8_,local_308._0_8_ + 1);
          }
          if ((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_) != local_338 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_338._4_4_,local_338._0_4_),
                            local_338._16_8_ + 1);
          }
          if ((local_88 == true) &&
             (local_88 = false, local_58._16_8_ = local_a8._16_8_,
             local_58._M_value._M_dataplus._M_p = local_a8._M_value._M_dataplus._M_p,
             local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10)))
          goto LAB_003b6065;
          goto LAB_003b606d;
        }
LAB_003b59d1:
        local_358.
        super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::allocator_traits<std::allocator<(anonymous_namespace)::NestingState>_>::
        destroy<(anonymous_namespace)::NestingState>
                  ((allocator_type *)
                   local_358.
                   super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(NestingState *)pcVar3);
        goto LAB_003b5a90;
      }
      iVar2 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar2 != 0) {
        pcVar3 = "endwhile";
        iVar2 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)psVar6);
          if (iVar2 == 0) {
            local_338._0_4_ = Foreach;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_378,this->FileName,&local_379);
            local_220 = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_240);
            std::
            vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ::push_back(&local_358,(value_type *)local_338);
            if ((local_2c8 == true) &&
               (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8)) {
              operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
            }
            if (local_310._M_p != local_308 + 8) {
              operator_delete(local_310._M_p,local_308._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._8_8_ != &local_320) {
              operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
            }
            if ((local_220 == true) &&
               (local_220 = false, uVar4 = local_240._16_8_,
               uVar5 = local_240._M_value._M_dataplus._M_p,
               local_240._M_value._M_dataplus._M_p !=
               (_Alloc_hider)((long)&local_240._M_value + 0x10))) goto LAB_003b5a6c;
          }
          else {
            pcVar3 = "endforeach";
            iVar2 = std::__cxx11::string::compare((char *)psVar6);
            if (iVar2 == 0) {
              if ((local_358.
                   super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_358.
                   super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (local_358.
                  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].State == Foreach))
              goto LAB_003b59d1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_378,this->FileName,&local_379);
              local_d8 = false;
              cmListFileContext::FromListFileFunction
                        ((cmListFileContext *)local_338,lff,&local_378,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f8);
              __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
              cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
              *(undefined1 *)
               &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus.
                _M_p = 1;
              cmListFileContext::~cmListFileContext((cmListFileContext *)local_338);
              if ((local_d8 == true) &&
                 (local_d8 = false, local_58._16_8_ = local_f8._16_8_,
                 local_58._M_value._M_dataplus._M_p = local_f8._M_value._M_dataplus._M_p,
                 local_f8._M_value._M_dataplus._M_p !=
                 (_Alloc_hider)((long)&local_f8._M_value + 0x10))) goto LAB_003b6065;
              goto LAB_003b606d;
            }
            iVar2 = std::__cxx11::string::compare((char *)psVar6);
            if (iVar2 == 0) {
              local_338._0_4_ = Function;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_378,this->FileName,&local_379);
              local_248 = false;
              cmListFileContext::FromListFileFunction
                        ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_268);
              std::
              vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ::push_back(&local_358,(value_type *)local_338);
              if ((local_2c8 == true) &&
                 (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8)) {
                operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
              }
              if (local_310._M_p != local_308 + 8) {
                operator_delete(local_310._M_p,local_308._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._8_8_ != &local_320) {
                operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
              }
              if ((local_248 == true) &&
                 (local_248 = false, uVar4 = local_268._16_8_,
                 uVar5 = local_268._M_value._M_dataplus._M_p,
                 local_268._M_value._M_dataplus._M_p !=
                 (_Alloc_hider)((long)&local_268._M_value + 0x10))) goto LAB_003b5a6c;
            }
            else {
              pcVar3 = "endfunction";
              iVar2 = std::__cxx11::string::compare((char *)psVar6);
              if (iVar2 == 0) {
                if ((local_358.
                     super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                     local_358.
                     super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
                   (local_358.
                    super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].State == Function))
                goto LAB_003b59d1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,this->FileName,&local_379);
                local_100 = false;
                cmListFileContext::FromListFileFunction
                          ((cmListFileContext *)local_338,lff,&local_378,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_120);
                __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
                cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
                *(undefined1 *)
                 &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus.
                  _M_p = 1;
                cmListFileContext::~cmListFileContext((cmListFileContext *)local_338);
                if ((local_100 == true) &&
                   (local_100 = false, local_58._16_8_ = local_120._16_8_,
                   local_58._M_value._M_dataplus._M_p = local_120._M_value._M_dataplus._M_p,
                   local_120._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_120._M_value + 0x10))) goto LAB_003b6065;
                goto LAB_003b606d;
              }
              iVar2 = std::__cxx11::string::compare((char *)psVar6);
              if (iVar2 == 0) {
                local_338._0_4_ = Macro;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,this->FileName,&local_379);
                local_270 = false;
                cmListFileContext::FromListFileFunction
                          ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_290);
                std::
                vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                ::push_back(&local_358,(NestingState *)local_338);
                anon_unknown.dwarf_15f98a3::NestingState::~NestingState((NestingState *)local_338);
                if ((local_270 == true) &&
                   (local_270 = false, uVar4 = local_290._16_8_,
                   uVar5 = local_290._M_value._M_dataplus._M_p,
                   local_290._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_290._M_value + 0x10))) goto LAB_003b5a6c;
              }
              else {
                pcVar3 = "endmacro";
                iVar2 = std::__cxx11::string::compare((char *)psVar6);
                if (iVar2 == 0) {
                  if ((local_358.
                       super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                       local_358.
                       super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     (local_358.
                      super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].State == Macro))
                  goto LAB_003b59d1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_378,this->FileName,&local_379);
                  local_128 = false;
                  cmListFileContext::FromListFileFunction
                            ((cmListFileContext *)local_338,lff,&local_378,
                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_148);
                  __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
                  cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
                  *(undefined1 *)
                   &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus
                    ._M_p = 1;
                  cmListFileContext::~cmListFileContext((cmListFileContext *)local_338);
                  if ((local_128 == true) &&
                     (local_128 = false, local_58._16_8_ = local_148._16_8_,
                     local_58._M_value._M_dataplus._M_p = local_148._M_value._M_dataplus._M_p,
                     local_148._M_value._M_dataplus._M_p !=
                     (_Alloc_hider)((long)&local_148._M_value + 0x10))) goto LAB_003b6065;
                  goto LAB_003b606d;
                }
                iVar2 = std::__cxx11::string::compare((char *)psVar6);
                if (iVar2 != 0) {
                  pcVar3 = "endblock";
                  iVar2 = std::__cxx11::string::compare((char *)psVar6);
                  if (iVar2 == 0) {
                    if ((local_358.
                         super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_358.
                         super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
                       (local_358.
                        super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].State != Block)) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_378,this->FileName,&local_379);
                      local_150 = false;
                      cmListFileContext::FromListFileFunction
                                ((cmListFileContext *)local_338,lff,&local_378,
                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_170);
                      __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
                      cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338)
                      ;
                      *(undefined1 *)
                       &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name).
                        _M_dataplus._M_p = 1;
                      cmListFileContext::~cmListFileContext((cmListFileContext *)local_338);
                      if ((local_150 == true) &&
                         (local_150 = false, local_58._16_8_ = local_170._16_8_,
                         local_58._M_value._M_dataplus._M_p = local_170._M_value._M_dataplus._M_p,
                         local_170._M_value._M_dataplus._M_p !=
                         (_Alloc_hider)((long)&local_170._M_value + 0x10))) goto LAB_003b6065;
                      goto LAB_003b606d;
                    }
                    local_358.
                    super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_358.
                         super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                    std::allocator_traits<std::allocator<(anonymous_namespace)::NestingState>_>::
                    destroy<(anonymous_namespace)::NestingState>
                              ((allocator_type *)
                               local_358.
                               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(NestingState *)pcVar3);
                  }
                  goto LAB_003b5a90;
                }
                local_338._0_4_ = Block;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,this->FileName,&local_379);
                local_298 = false;
                cmListFileContext::FromListFileFunction
                          ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_2b8);
                std::
                vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                ::push_back(&local_358,(NestingState *)local_338);
                anon_unknown.dwarf_15f98a3::NestingState::~NestingState((NestingState *)local_338);
                if ((local_298 == true) &&
                   (local_298 = false, uVar4 = local_2b8._16_8_,
                   uVar5 = local_2b8._M_value._M_dataplus._M_p,
                   local_2b8._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_2b8._M_value + 0x10))) goto LAB_003b5a6c;
              }
            }
          }
          goto LAB_003b5a74;
        }
        if ((local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_358.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (local_358.
            super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].State == While)) goto LAB_003b59d1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,this->FileName,&local_379);
        local_b0 = false;
        cmListFileContext::FromListFileFunction
                  ((cmListFileContext *)local_338,lff,&local_378,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0);
        __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
        cmListFileContext::cmListFileContext(local_340,(cmListFileContext *)local_338);
        *(undefined1 *)
         &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p = 1;
        cmListFileContext::~cmListFileContext((cmListFileContext *)local_338);
        if ((local_b0 == true) &&
           (local_b0 = false, local_58._16_8_ = local_d0._16_8_,
           local_58._M_value._M_dataplus._M_p = local_d0._M_value._M_dataplus._M_p,
           local_d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_d0._M_value + 0x10)))
        goto LAB_003b6065;
LAB_003b606d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003b6089;
      }
      local_338._0_4_ = While;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,this->FileName,&local_379);
      local_1f8 = false;
      cmListFileContext::FromListFileFunction
                ((cmListFileContext *)(local_338 + 8),lff,&local_378,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_218);
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::push_back(&local_358,(value_type *)local_338);
      if ((local_2c8 == true) && (local_2c8 = false, (undefined1 *)local_2f0._8_8_ != local_2d8)) {
        operator_delete((void *)local_2f0._8_8_,local_2d8._0_8_ + 1);
      }
      if (local_310._M_p != local_308 + 8) {
        operator_delete(local_310._M_p,local_308._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._8_8_ != &local_320) {
        operator_delete((void *)local_338._8_8_,local_320._M_allocated_capacity + 1);
      }
      if ((local_1f8 == true) &&
         (local_1f8 = false, uVar4 = local_218._16_8_, uVar5 = local_218._M_value._M_dataplus._M_p,
         local_218._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_218._M_value + 0x10)))
      goto LAB_003b5a6c;
    }
LAB_003b5a74:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
LAB_003b5a90:
    __return_storage_ptr__ = (optional<cmListFileContext> *)local_340;
    lff = lff + 1;
    if (lff == local_178) goto code_r0x003b5aa2;
    goto LAB_003b50e9;
  }
  goto LAB_003b5aca;
code_r0x003b5aa2:
  if (local_358.
      super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_358.
      super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmListFileContext::cmListFileContext
              (local_340,
               &local_358.
                super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].Context);
    *(undefined1 *)
     &(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p = 1;
    goto LAB_003b6089;
  }
LAB_003b5aca:
  *(bool *)&(((cmListFileContext *)((long)__return_storage_ptr__ + 0x70))->Name)._M_dataplus._M_p =
       false;
LAB_003b6089:
  std::
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ::~vector(&local_358);
  return (optional<cmListFileContext> *)(cmListFileContext *)__return_storage_ptr__;
}

Assistant:

cm::optional<cmListFileContext> cmListFileParser::CheckNesting() const
{
  std::vector<NestingState> stack;

  for (auto const& func : this->ListFile->Functions) {
    auto const& name = func.LowerCaseName();
    if (name == "if") {
      stack.push_back({
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "elseif") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "else") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::Else,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "endif") {
      if (!TopIs(stack, NestingStateEnum::If) &&
          !TopIs(stack, NestingStateEnum::Else)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "while") {
      stack.push_back({
        NestingStateEnum::While,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endwhile") {
      if (!TopIs(stack, NestingStateEnum::While)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "foreach") {
      stack.push_back({
        NestingStateEnum::Foreach,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endforeach") {
      if (!TopIs(stack, NestingStateEnum::Foreach)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "function") {
      stack.push_back({
        NestingStateEnum::Function,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endfunction") {
      if (!TopIs(stack, NestingStateEnum::Function)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "macro") {
      stack.push_back({
        NestingStateEnum::Macro,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endmacro") {
      if (!TopIs(stack, NestingStateEnum::Macro)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "block") {
      stack.push_back({
        NestingStateEnum::Block,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endblock") {
      if (!TopIs(stack, NestingStateEnum::Block)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    }
  }

  if (!stack.empty()) {
    return stack.back().Context;
  }

  return cm::nullopt;
}